

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.h
# Opt level: O2

void clear_catalog(catalog_t *catalog)

{
  free(catalog->objects);
  free(catalog->enums);
  free(catalog->services);
  free(catalog->name_table);
  catalog->next_name = (char *)0x0;
  catalog->schema = (fb_schema_t *)0x0;
  catalog->next_enum = (enum_entry_t *)0x0;
  catalog->next_service = (service_entry_t *)0x0;
  catalog->name_table = (char *)0x0;
  catalog->next_object = (object_entry_t *)0x0;
  catalog->enums = (enum_entry_t *)0x0;
  catalog->services = (service_entry_t *)0x0;
  catalog->name_table_size = 0;
  catalog->objects = (object_entry_t *)0x0;
  catalog->qualify_names = 0;
  catalog->nobjects = 0;
  catalog->nenums = 0;
  catalog->nservices = 0;
  return;
}

Assistant:

static void clear_catalog(catalog_t *catalog)
{
    if (catalog->objects) {
        free(catalog->objects);
    }
    if (catalog->enums) {
        free(catalog->enums);
    }
    if (catalog->services) {
        free(catalog->services);
    }
    if (catalog->name_table) {
        free(catalog->name_table);
    }
    memset(catalog, 0, sizeof(*catalog));
}